

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TensorExprTree.h
# Opt level: O3

void __thiscall phaeton::IdentifierExpr::~IdentifierExpr(IdentifierExpr *this)

{
  pointer pcVar1;
  
  (this->super_ExpressionNode)._vptr_ExpressionNode = (_func_int **)&PTR__IdentifierExpr_00162b60;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&this->IndexPairs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Indices);
  pcVar1 = (this->Name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->Name).field_2) {
    operator_delete(pcVar1);
  }
  ExpressionNode::~ExpressionNode(&this->super_ExpressionNode);
  return;
}

Assistant:

IdentifierExpr(const std::string &Name, const ExprDims &ED)
      : ExpressionNode(EXPR_KIND_Identifier, /*NumChildren=*/0, ED), Name(Name),
        Permute(false), ElementIndexPosition(-1) {}